

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# volk.c
# Opt level: O0

void volkInitializeCustom(PFN_vkGetInstanceProcAddr handler)

{
  PFN_vkGetInstanceProcAddr handler_local;
  
  vkGetInstanceProcAddr = handler;
  volkGenLoadLoader((void *)0x0,vkGetInstanceProcAddrStub);
  return;
}

Assistant:

void volkInitializeCustom(PFN_vkGetInstanceProcAddr handler)
{
	vkGetInstanceProcAddr = handler;

	volkGenLoadLoader(NULL, vkGetInstanceProcAddrStub);
}